

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O0

void sighandler(int sig,siginfo_t *info,void *vp)

{
  void *vp_local;
  siginfo_t *info_local;
  int sig_local;
  
  switch(sig) {
  case 2:
  case 0xf:
    s.signal_num = sig;
    break;
  case 10:
    s.sig_usr1 = 1;
    break;
  case 0xe:
    s.sig_alrm = 1;
  }
  return;
}

Assistant:

static void sighandler(int sig, siginfo_t *info, void *vp)
{
	switch (sig) {
	case SIGINT:
	case SIGTERM:
		s.signal_num = sig;
		break;
	case SIGALRM:
		s.sig_alrm = 1;
		break;
	case SIGUSR1:
		s.sig_usr1 = 1;
		break;
	}
}